

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O3

t_pool_result * t_pool_next_result(t_results_queue *q)

{
  t_pool_result *ptVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&q->result_m);
  ptVar1 = t_pool_next_result_locked(q);
  pthread_mutex_unlock((pthread_mutex_t *)&q->result_m);
  return ptVar1;
}

Assistant:

t_pool_result *t_pool_next_result(t_results_queue *q) {
    t_pool_result *r;

#ifdef DEBUG
    fprintf(stderr, "Requesting next result on queue %p\n", q);
#endif

    pthread_mutex_lock(&q->result_m);
    r = t_pool_next_result_locked(q);
    pthread_mutex_unlock(&q->result_m);

#ifdef DEBUG
    fprintf(stderr, "(q=%p) Found %p\n", q, r);
#endif

    return r;
}